

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O0

void __thiscall
hwtest::pgraph::MthdCelsiusVtxbufFormat::~MthdCelsiusVtxbufFormat(MthdCelsiusVtxbufFormat *this)

{
  MthdCelsiusVtxbufFormat *this_local;
  
  pgraph::SingleMthdTest::~SingleMthdTest(&this->super_SingleMthdTest);
  return;
}

Assistant:

void adjust_orig_mthd() override {
		if (rnd() & 1) {
			val &= 0x0100fc77;
			if (rnd() & 1)
				val ^= 1 << (rnd() & 0x1f);
			if (rnd() & 3)
				insrt(val, 0, 3, 6);
			if (rnd() & 3)
				insrt(val, 4, 3, idx < 6 ? 3 : 1);
		}
	}